

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O0

Vec_Wrd_t * Mpm_ManGetTruthWithCnf(int Limit)

{
  Vec_Wrd_t *p;
  int local_1c;
  int i;
  Vec_Wrd_t *vRes;
  int Limit_local;
  
  p = Vec_WrdAlloc(1000);
  for (local_1c = 0; local_1c < 0x253; local_1c = local_1c + 1) {
    if (s_DsdClass6[local_1c].nClauses <= Limit) {
      Vec_WrdPush(p,s_DsdClass6[local_1c].uTruth);
    }
  }
  return p;
}

Assistant:

Vec_Wrd_t * Mpm_ManGetTruthWithCnf( int Limit )
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 1000 );
    int i;
    for ( i = 0; i < 595; i++ )
        if ( s_DsdClass6[i].nClauses <= Limit )
            Vec_WrdPush( vRes, s_DsdClass6[i].uTruth );
    return vRes;
}